

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddTargetDepends
          (cmGlobalGenerator *this,cmTarget *target,TargetDependSet *projectTargets)

{
  TargetDependSet *pTVar1;
  _Base_ptr p_Var2;
  pair<std::_Rb_tree_iterator<cmTargetDepend>,_bool> pVar3;
  cmTargetDepend local_30;
  
  local_30.Link = false;
  local_30.Util = false;
  local_30.Target = target;
  pVar3 = std::
          _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
          ::_M_insert_unique<cmTargetDepend>
                    ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      *)projectTargets,&local_30);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pTVar1 = GetTargetDirectDepends(this,target);
    for (p_Var2 = (pTVar1->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 !=
        &(pTVar1->
         super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t
         ._M_impl.super__Rb_tree_header; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      AddTargetDepends(this,*(cmTarget **)(p_Var2 + 1),projectTargets);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddTargetDepends(cmTarget const* target,
                                         TargetDependSet& projectTargets)
{
  // add the target itself
  if(projectTargets.insert(target).second)
    {
    // This is the first time we have encountered the target.
    // Recursively follow its dependencies.
    TargetDependSet const& ts = this->GetTargetDirectDepends(*target);
    for(TargetDependSet::const_iterator i = ts.begin(); i != ts.end(); ++i)
      {
      cmTarget const* dtarget = *i;
      this->AddTargetDepends(dtarget, projectTargets);
      }
    }
}